

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interpreter.c
# Opt level: O0

char * parse_ld_trace_line_path(char *line)

{
  char *pcVar1;
  ushort **ppuVar2;
  bool bVar3;
  char *path_end;
  char *path_start;
  char *path;
  char *line_local;
  
  pcVar1 = strstr(line,"=> ");
  path_end = line;
  if (pcVar1 == (char *)0x0) {
    while( true ) {
      bVar3 = false;
      if (path_end != (char *)0x0) {
        ppuVar2 = __ctype_b_loc();
        bVar3 = ((*ppuVar2)[(int)*path_end] & 0x2000) != 0;
      }
      if (!bVar3) break;
      path_end = path_end + 1;
    }
  }
  else {
    path_end = pcVar1 + 3;
  }
  pcVar1 = strstr(path_end," (");
  if (pcVar1 == (char *)0x0) {
    path_start = strdup(path_end);
  }
  else {
    path_start = strndup(path_end,(long)pcVar1 - (long)path_end);
  }
  return path_start;
}

Assistant:

char *parse_ld_trace_line_path(const char *line) {
    char *path = NULL;
    const char *path_start = strstr(line, "=> ");
    if (path_start != NULL) {
        path_start += 3;
    } else {
        path_start = line;
        while (path_start != NULL && isspace(*path_start))
            path_start++;
    }

    char *path_end = strstr(path_start, " (");

    if (path_end != NULL)
        path = strndup(path_start, path_end - path_start);
    else
        path = strdup(path_start);


    return path;
}